

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O2

int CBB_init_fixed(CBB *cbb,uint8_t *buf,size_t len)

{
  (cbb->u).base.buf = (uint8_t *)0x0;
  (cbb->u).base.len = 0;
  (cbb->u).base.cap = 0;
  *(undefined8 *)((long)&cbb->u + 0x18) = 0;
  cbb->child = (CBB *)0x0;
  *(undefined8 *)&cbb->is_child = 0;
  (cbb->u).base.buf = buf;
  (cbb->u).base.cap = len;
  return 1;
}

Assistant:

static void cbb_init(CBB *cbb, uint8_t *buf, size_t cap, int can_resize) {
  cbb->is_child = 0;
  cbb->child = NULL;
  cbb->u.base.buf = buf;
  cbb->u.base.len = 0;
  cbb->u.base.cap = cap;
  cbb->u.base.can_resize = can_resize;
  cbb->u.base.error = 0;
}